

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O3

void __thiscall crnlib::command_line_params::clear(command_line_params *this)

{
  long lVar1;
  long lVar2;
  dynamic_string *p;
  ulong uVar3;
  
  p = (this->m_params).m_p;
  if (p != (dynamic_string *)0x0) {
    uVar3 = (ulong)(this->m_params).m_size;
    if (uVar3 != 0) {
      lVar2 = 0;
      do {
        lVar1 = *(long *)((long)&p->m_pStr + lVar2);
        if ((lVar1 != 0) && ((*(uint *)(lVar1 + -8) ^ *(uint *)(lVar1 + -4)) == 0xffffffff)) {
          crnlib_free((void *)(lVar1 + -0x10));
        }
        lVar2 = lVar2 + 0x10;
      } while (uVar3 << 4 != lVar2);
      p = (this->m_params).m_p;
    }
    crnlib_free(p);
    (this->m_params).m_p = (dynamic_string *)0x0;
    (this->m_params).m_size = 0;
    (this->m_params).m_capacity = 0;
  }
  std::
  _Rb_tree<crnlib::dynamic_string,_std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>,_std::_Select1st<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>,_std::less<crnlib::dynamic_string>,_std::allocator<std::pair<const_crnlib::dynamic_string,_crnlib::command_line_params::param_value>_>_>
  ::clear(&(this->m_param_map)._M_t);
  return;
}

Assistant:

void command_line_params::clear() {
  m_params.clear();

  m_param_map.clear();
}